

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::TeamCityReporter::printSectionHeader(TeamCityReporter *this,ostream *os)

{
  pointer pSVar1;
  pointer pSVar2;
  SourceLineInfo lineInfo;
  
  pSVar2 = (this->super_StreamingReporterBase).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (1 < (ulong)(((long)(this->super_StreamingReporterBase).m_sectionStack.
                         super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0x30)) {
    Catch::operator<<(os,(lineOfChars)0x2d);
    std::operator<<(os,'\n');
    pSVar2 = (this->super_StreamingReporterBase).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    pSVar1 = (this->super_StreamingReporterBase).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pSVar2 = pSVar2 + 1, pSVar2 != pSVar1) {
      std::__cxx11::string::find((char *)pSVar2,0x16c3e8);
      TextFlow::Column::Column((Column *)&lineInfo,&pSVar2->name);
      TextFlow::operator<<(os,(Column *)&lineInfo);
      std::operator<<(os,'\n');
      std::__cxx11::string::~string((string *)&lineInfo);
    }
    Catch::operator<<(os,(lineOfChars)0x2d);
    std::operator<<(os,'\n');
    pSVar2 = (this->super_StreamingReporterBase).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  lineInfo.file = (pSVar2->lineInfo).file;
  lineInfo.line = (pSVar2->lineInfo).line;
  Catch::operator<<(os,&lineInfo);
  std::operator<<(os,'\n');
  Catch::operator<<(os,(lineOfChars)0x2e);
  std::operator<<(os,"\n\n");
  return;
}

Assistant:

void TeamCityReporter::printSectionHeader(std::ostream& os) {
        assert(!m_sectionStack.empty());

        if (m_sectionStack.size() > 1) {
            os << lineOfChars('-') << '\n';

            std::vector<SectionInfo>::const_iterator
                it = m_sectionStack.begin() + 1, // Skip first section (test case)
                itEnd = m_sectionStack.end();
            for (; it != itEnd; ++it)
                printHeaderString(os, it->name);
            os << lineOfChars('-') << '\n';
        }

        SourceLineInfo lineInfo = m_sectionStack.front().lineInfo;

        os << lineInfo << '\n';
        os << lineOfChars('.') << "\n\n";
    }